

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O1

h2o_filecache_ref_t * h2o_filecache_open_file(h2o_filecache_t *cache,char *path,int oflag)

{
  h2o_linklist_t *phVar1;
  long *plVar2;
  kh_opencache_set_t *pkVar3;
  khint32_t *pkVar4;
  st_h2o_linklist_t *psVar5;
  kh_cstr_t pcVar6;
  long lVar7;
  st_h2o_linklist_t *psVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  khint_t kVar12;
  size_t sVar13;
  h2o_filecache_ref_t *ref;
  char *pcVar14;
  int *piVar15;
  byte bVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  khint_t kVar20;
  khint_t kVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  
  pkVar3 = cache->hash;
  kVar21 = pkVar3->n_buckets;
  if (kVar21 == 0) {
    uVar10 = 0;
  }
  else {
    uVar24 = (uint)*path;
    if (*path == '\0') {
      uVar24 = 0;
    }
    else {
      cVar9 = path[1];
      if (cVar9 != '\0') {
        pcVar17 = path + 2;
        do {
          uVar24 = (int)cVar9 + uVar24 * 0x1f;
          cVar9 = *pcVar17;
          pcVar17 = pcVar17 + 1;
        } while (cVar9 != '\0');
      }
    }
    uVar24 = uVar24 & kVar21 - 1;
    pkVar4 = pkVar3->flags;
    iVar22 = 1;
    uVar23 = uVar24;
    do {
      uVar18 = pkVar4[uVar23 >> 4];
      bVar16 = (char)uVar23 * '\x02' & 0x1e;
      uVar10 = uVar18 >> bVar16;
      if (((uVar10 & 2) != 0) ||
         (((uVar10 & 1) == 0 && (iVar11 = strcmp(pkVar3->keys[uVar23],path), iVar11 == 0)))) {
        uVar10 = uVar23;
        if ((uVar18 >> bVar16 & 3) != 0) {
          uVar10 = kVar21;
        }
        break;
      }
      uVar23 = uVar23 + iVar22 & kVar21 - 1;
      iVar22 = iVar22 + 1;
      uVar10 = kVar21;
    } while (uVar23 != uVar24);
  }
  if (uVar10 != kVar21) {
    pcVar6 = pkVar3->keys[uVar10];
    plVar2 = (long *)(pcVar6 + -0x128);
    *plVar2 = *plVar2 + 1;
    ref = (h2o_filecache_ref_t *)(pcVar6 + -0x130);
    goto LAB_0012687e;
  }
  sVar13 = strlen(path);
  ref = (h2o_filecache_ref_t *)malloc(sVar13 + 0x131);
  if (ref == (h2o_filecache_ref_t *)0x0) {
    h2o__fatal(
              "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
              );
  }
  ref->_refcnt = 1;
  pcVar17 = ref->_path;
  (ref->_lru).next = (st_h2o_linklist_t *)0x0;
  (ref->_lru).prev = (st_h2o_linklist_t *)0x0;
  strcpy(pcVar17,path);
  if (cache->capacity != 0) {
    if (cache->capacity == (ulong)pkVar3->size) {
      uVar10 = pkVar3->n_buckets;
      if (uVar10 == 0) {
        uVar24 = 0;
      }
      else {
        psVar5 = (cache->lru).prev;
        cVar9 = *(char *)&psVar5[0x12].next;
        uVar23 = (uint)cVar9;
        if (cVar9 == '\0') {
          uVar23 = 0;
        }
        else {
          cVar9 = *(char *)((long)&psVar5[0x12].next + 1);
          if (cVar9 != '\0') {
            pcVar14 = (char *)((long)&psVar5[0x12].next + 2);
            do {
              uVar23 = (int)cVar9 + uVar23 * 0x1f;
              cVar9 = *pcVar14;
              pcVar14 = pcVar14 + 1;
            } while (cVar9 != '\0');
          }
        }
        uVar23 = uVar23 & uVar10 - 1;
        pkVar4 = pkVar3->flags;
        iVar22 = 1;
        uVar18 = uVar23;
        do {
          uVar19 = pkVar4[uVar18 >> 4];
          bVar16 = (char)uVar18 * '\x02' & 0x1e;
          uVar24 = uVar19 >> bVar16;
          if (((uVar24 & 2) != 0) ||
             (((uVar24 & 1) == 0 &&
              (iVar11 = strcmp(pkVar3->keys[uVar18],(char *)(psVar5 + 0x12)), iVar11 == 0)))) {
            uVar24 = uVar18;
            if ((uVar19 >> bVar16 & 3) != 0) {
              uVar24 = uVar10;
            }
            break;
          }
          uVar18 = uVar18 + iVar22 & uVar10 - 1;
          iVar22 = iVar22 + 1;
          uVar24 = uVar10;
        } while (uVar18 != uVar23);
      }
      if (uVar24 == uVar10) {
        __assert_fail("purge_iter != kh_end(cache->hash)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
                      ,0x6c,
                      "h2o_filecache_ref_t *h2o_filecache_open_file(h2o_filecache_t *, const char *, int)"
                     );
      }
      pcVar6 = pkVar3->keys[uVar24];
      uVar10 = pkVar3->flags[uVar24 >> 4];
      uVar23 = uVar24 * 2 & 0x1e;
      if ((uVar10 >> (sbyte)uVar23 & 3) == 0) {
        pkVar3->flags[uVar24 >> 4] = uVar10 | 1 << uVar23;
        pkVar3->size = pkVar3->size - 1;
      }
      lVar7 = *(long *)(pcVar6 + -0x120);
      *(undefined8 *)(lVar7 + 8) = *(undefined8 *)(pcVar6 + -0x118);
      **(long **)(pcVar6 + -0x118) = lVar7;
      pcVar6[-0x120] = '\0';
      pcVar6[-0x11f] = '\0';
      pcVar6[-0x11e] = '\0';
      pcVar6[-0x11d] = '\0';
      pcVar6[-0x11c] = '\0';
      pcVar6[-0x11b] = '\0';
      pcVar6[-0x11a] = '\0';
      pcVar6[-0x119] = '\0';
      pcVar6[-0x118] = '\0';
      pcVar6[-0x117] = '\0';
      pcVar6[-0x116] = '\0';
      pcVar6[-0x115] = '\0';
      pcVar6[-0x114] = '\0';
      pcVar6[-0x113] = '\0';
      pcVar6[-0x112] = '\0';
      pcVar6[-0x111] = '\0';
      h2o_filecache_close_file((h2o_filecache_ref_t *)(pcVar6 + -0x130));
    }
    phVar1 = &ref->_lru;
    ref->_refcnt = ref->_refcnt + 1;
    pkVar3 = cache->hash;
    if (pkVar3->n_occupied < pkVar3->upper_bound) {
LAB_0012664c:
      kVar21 = pkVar3->n_buckets;
      uVar10 = (uint)*pcVar17;
      if (*pcVar17 == '\0') {
        uVar10 = 0;
      }
      else {
        cVar9 = ref->field_0x131;
        if (cVar9 != '\0') {
          pcVar14 = &ref->field_0x132;
          do {
            uVar10 = (int)cVar9 + uVar10 * 0x1f;
            cVar9 = *pcVar14;
            pcVar14 = pcVar14 + 1;
          } while (cVar9 != '\0');
        }
      }
      uVar10 = uVar10 & kVar21 - 1;
      pkVar4 = pkVar3->flags;
      if ((pkVar4[uVar10 >> 4] >> ((char)uVar10 * '\x02' & 0x1fU) & 2) == 0) {
        iVar22 = 1;
        uVar24 = uVar10;
        kVar20 = kVar21;
        do {
          uVar23 = pkVar4[uVar24 >> 4];
          uVar19 = uVar24 * 2 & 0x1e;
          uVar18 = uVar23 >> (sbyte)uVar19;
          kVar12 = kVar21;
          if (((uVar18 & 2) != 0) ||
             (((uVar18 & 1) == 0 && (iVar11 = strcmp(pkVar3->keys[uVar24],pcVar17), iVar11 == 0))))
          break;
          kVar12 = kVar20;
          if ((uVar23 >> uVar19 & 1) != 0) {
            kVar12 = uVar24;
          }
          uVar24 = uVar24 + iVar22 & kVar21 - 1;
          iVar22 = iVar22 + 1;
          kVar20 = kVar12;
        } while (uVar24 != uVar10);
        uVar10 = kVar12;
        if (kVar12 == kVar21) {
          if (kVar20 == kVar21) {
            kVar20 = uVar24;
          }
          uVar10 = kVar20;
          if ((pkVar4[uVar24 >> 4] >> ((char)uVar24 * '\x02' & 0x1fU) & 2) == 0) {
            uVar10 = uVar24;
          }
        }
      }
      uVar24 = uVar10 >> 4;
      bVar16 = (char)uVar10 * '\x02' & 0x1e;
      if ((pkVar4[uVar24] >> bVar16 & 2) == 0) {
        if ((pkVar4[uVar24] >> bVar16 & 1) != 0) {
          pkVar3->keys[uVar10] = pcVar17;
          pkVar3->flags[uVar24] = pkVar3->flags[uVar24] & ~(3 << bVar16);
          pkVar3->size = pkVar3->size + 1;
        }
      }
      else {
        pkVar3->keys[uVar10] = pcVar17;
        pkVar3->flags[uVar24] = pkVar3->flags[uVar24] & ~(3 << bVar16);
        pkVar3->size = pkVar3->size + 1;
        pkVar3->n_occupied = pkVar3->n_occupied + 1;
      }
    }
    else {
      uVar10 = pkVar3->n_buckets;
      if (pkVar3->size * 2 < uVar10) {
        kVar21 = uVar10 - 1;
      }
      else {
        kVar21 = uVar10 + 1;
      }
      iVar22 = kh_resize_opencache_set(pkVar3,kVar21);
      if (-1 < iVar22) goto LAB_0012664c;
    }
    if (phVar1->next != (st_h2o_linklist_t *)0x0) {
      __assert_fail("!h2o_linklist_is_linked(node)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/linklist.h"
                    ,0x59,"void h2o_linklist_insert(h2o_linklist_t *, h2o_linklist_t *)");
    }
    psVar5 = (cache->lru).next;
    psVar8 = psVar5->prev;
    (ref->_lru).prev = psVar8;
    (ref->_lru).next = psVar5;
    psVar8->next = phVar1;
    ((ref->_lru).next)->prev = phVar1;
  }
  iVar22 = open(path,oflag);
  ref->fd = iVar22;
  if ((iVar22 == -1) || (iVar22 = fstat(iVar22,(stat *)&(ref->field_3).field_0), iVar22 != 0)) {
    piVar15 = __errno_location();
    (ref->field_3).open_err = *piVar15;
    if (ref->fd != -1) {
      close(ref->fd);
      ref->fd = -1;
    }
  }
  else {
    *(undefined1 *)((long)&ref->field_3 + 200) = 0;
    *(undefined8 *)((long)&ref->field_3 + 0x108) = 0;
  }
LAB_0012687e:
  if (ref->fd == -1) {
    iVar22 = (ref->field_3).open_err;
    piVar15 = __errno_location();
    *piVar15 = iVar22;
    h2o_filecache_close_file(ref);
    ref = (h2o_filecache_ref_t *)0x0;
  }
  return ref;
}

Assistant:

h2o_filecache_ref_t *h2o_filecache_open_file(h2o_filecache_t *cache, const char *path, int oflag)
{
    khiter_t iter = kh_get(opencache_set, cache->hash, path);
    h2o_filecache_ref_t *ref;
    int dummy;

    /* lookup cache, and return the one if found */
    if (iter != kh_end(cache->hash)) {
        ref = H2O_STRUCT_FROM_MEMBER(h2o_filecache_ref_t, _path, kh_key(cache->hash, iter));
        ++ref->_refcnt;
        goto Exit;
    }

    /* create a new cache entry */
    ref = h2o_mem_alloc(offsetof(h2o_filecache_ref_t, _path) + strlen(path) + 1);
    ref->_refcnt = 1;
    ref->_lru = (h2o_linklist_t){NULL};
    strcpy(ref->_path, path);

    /* if cache is used, then... */
    if (cache->capacity != 0) {
        /* purge one entry from LRU if cache is full */
        if (kh_size(cache->hash) == cache->capacity) {
            h2o_filecache_ref_t *purge_ref = H2O_STRUCT_FROM_MEMBER(h2o_filecache_ref_t, _lru, cache->lru.prev);
            khiter_t purge_iter = kh_get(opencache_set, cache->hash, purge_ref->_path);
            assert(purge_iter != kh_end(cache->hash));
            release_from_cache(cache, purge_iter);
        }
        /* assign the new entry */
        ++ref->_refcnt;
        kh_put(opencache_set, cache->hash, ref->_path, &dummy);
        h2o_linklist_insert(cache->lru.next, &ref->_lru);
    }

    /* open the file, or memoize the error */
    if ((ref->fd = open(path, oflag)) != -1 && fstat(ref->fd, &ref->st) == 0) {
        ref->_last_modified.str[0] = '\0';
        ref->_etag.len = 0;
    } else {
        ref->open_err = errno;
        if (ref->fd != -1) {
            close(ref->fd);
            ref->fd = -1;
        }
    }

Exit:
    /* if the cache entry retains an error, return it instead of the reference */
    if (ref->fd == -1) {
        errno = ref->open_err;
        h2o_filecache_close_file(ref);
        ref = NULL;
    }
    return ref;
}